

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uint128.cpp
# Opt level: O1

void __thiscall UInt128_ToHexString_Test::~UInt128_ToHexString_Test(UInt128_ToHexString_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (UInt128, ToHexString) {
    {
        std::string str1;
        pstore::uint128 (0, 0).to_hex (std::back_inserter (str1));
        EXPECT_EQ (str1, "00000000000000000000000000000000");
    }
    {
        std::string str2;
        pstore::uint128 (1, 2).to_hex (std::back_inserter (str2));
        EXPECT_EQ (str2, "00000000000000010000000000000002");
    }
    {
        std::string str3;
        pstore::uint128 (std::numeric_limits<std::uint64_t>::max (),
                         std::numeric_limits<std::uint64_t>::max ())
            .to_hex (std::back_inserter (str3));
        EXPECT_EQ (str3, "ffffffffffffffffffffffffffffffff");
    }
}